

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O1

void __thiscall llvm::DWARFGdbIndex::dump(DWARFGdbIndex *this,raw_ostream *OS)

{
  char *__n;
  raw_ostream *prVar1;
  void *__buf;
  StringRef Str;
  StringRef Str_00;
  
  if (this->HasError == true) {
    Str.Length = 0x11;
    Str.Data = "\n<error parsing>\n";
    raw_ostream::operator<<(OS,Str);
    return;
  }
  if (this->HasContent == true) {
    Str_00.Length = 0xc;
    Str_00.Data = "  Version = ";
    prVar1 = raw_ostream::operator<<(OS,Str_00);
    prVar1 = raw_ostream::operator<<(prVar1,(ulong)this->Version);
    __n = prVar1->OutBufCur;
    if (__n < prVar1->OutBufEnd) {
      prVar1->OutBufCur = __n + 1;
      *__n = '\n';
    }
    else {
      raw_ostream::write(prVar1,10,__buf,(size_t)__n);
    }
    dumpCUList(this,OS);
    dumpTUList(this,OS);
    dumpAddressArea(this,OS);
    dumpSymbolTable(this,OS);
    dumpConstantPool(this,OS);
    return;
  }
  return;
}

Assistant:

void DWARFGdbIndex::dump(raw_ostream &OS) {
  if (HasError) {
    OS << "\n<error parsing>\n";
    return;
  }

  if (HasContent) {
    OS << "  Version = " << Version << '\n';
    dumpCUList(OS);
    dumpTUList(OS);
    dumpAddressArea(OS);
    dumpSymbolTable(OS);
    dumpConstantPool(OS);
  }
}